

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerMSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t physical_type_id,bool is_packed,bool relaxed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  char (*pacVar5) [2];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,physical_type_id);
  pacVar5 = (char (*) [2])(ulong)physical_type_id;
  bVar4 = Compiler::is_matrix((Compiler *)this,exp_type);
  if (bVar4) {
    CompilerGLSL::strip_enclosed_expression(&this->super_CompilerGLSL,exp_str);
    if (physical_type_id != 0 || is_packed) {
      local_70[0] = local_60;
      pcVar2 = (exp_str->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + exp_str->_M_string_length);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])
                (local_50,this,local_70,exp_type,pacVar5,is_packed,1);
      ::std::__cxx11::string::operator=((string *)exp_str,(string *)local_50);
      ts_2 = pacVar5;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
        ts_2 = pacVar5;
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x38a8cd,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,ts_2);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(exp_str->_M_dataplus)._M_p;
    paVar1 = &exp_str->field_2;
    if (paVar3 == paVar1) {
      local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&exp_str->field_2 + 8);
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_90._M_dataplus._M_p = (pointer)paVar3;
    }
    local_90._M_string_length = exp_str->_M_string_length;
    (exp_str->_M_dataplus)._M_p = (pointer)paVar1;
    exp_str->_M_string_length = 0;
    (exp_str->field_2)._M_local_buf[0] = '\0';
    CompilerGLSL::convert_row_major_matrix
              (__return_storage_ptr__,&this->super_CompilerGLSL,&local_90,exp_type,physical_type_id,
               is_packed,relaxed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t physical_type_id,
                                             bool is_packed, bool relaxed)
{
	if (!is_matrix(exp_type))
	{
		return CompilerGLSL::convert_row_major_matrix(std::move(exp_str), exp_type, physical_type_id, is_packed, relaxed);
	}
	else
	{
		strip_enclosed_expression(exp_str);
		if (physical_type_id != 0 || is_packed)
			exp_str = unpack_expression_type(exp_str, exp_type, physical_type_id, is_packed, true);
		return join("transpose(", exp_str, ")");
	}
}